

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

void Ifd_ManHashInsert(Ifd_Man_t *p,int iDsd0,int iDsd1,int iDsdC,int Type,int Res)

{
  Hsh_IntMan_t *p_00;
  int iVar1;
  int iVar2;
  int iObj;
  int Res_local;
  int Type_local;
  int iDsdC_local;
  int iDsd1_local;
  int iDsd0_local;
  Ifd_Man_t *p_local;
  
  if ((iDsdC == -1) && (iDsd0 < iDsd1)) {
    __assert_fail("iDsdC != -1 || iDsd0 >= iDsd1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                  ,0x172,"void Ifd_ManHashInsert(Ifd_Man_t *, int, int, int, int, int)");
  }
  if (iDsdC != -1) {
    iVar1 = Abc_LitIsCompl(iDsd1);
    if (iVar1 != 0) {
      __assert_fail("iDsdC == -1 || !Abc_LitIsCompl(iDsd1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                    ,0x173,"void Ifd_ManHashInsert(Ifd_Man_t *, int, int, int, int, int)");
    }
  }
  Vec_IntPush(p->vArgs,iDsd0);
  Vec_IntPush(p->vArgs,iDsd1);
  Vec_IntPush(p->vArgs,iDsdC);
  Vec_IntPush(p->vArgs,Type);
  p_00 = p->vHash;
  iVar1 = Vec_IntSize(p->vRes);
  iVar1 = Hsh_IntManAdd(p_00,iVar1);
  iVar2 = Vec_IntSize(p->vRes);
  if (iVar1 == iVar2) {
    Vec_IntPush(p->vRes,Res);
    iVar1 = Vec_IntSize(p->vRes);
    iVar2 = Vec_IntSize(p->vArgs);
    if (iVar1 << 2 == iVar2) {
      return;
    }
    __assert_fail("4 * Vec_IntSize(p->vRes) == Vec_IntSize(p->vArgs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                  ,0x17b,"void Ifd_ManHashInsert(Ifd_Man_t *, int, int, int, int, int)");
  }
  __assert_fail("iObj == Vec_IntSize(p->vRes)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                ,0x179,"void Ifd_ManHashInsert(Ifd_Man_t *, int, int, int, int, int)");
}

Assistant:

void Ifd_ManHashInsert( Ifd_Man_t * p, int iDsd0, int iDsd1, int iDsdC, int Type, int Res )
{
    int iObj;
    assert( iDsdC != -1 || iDsd0 >= iDsd1 );
    assert( iDsdC == -1 || !Abc_LitIsCompl(iDsd1) );
    Vec_IntPush( p->vArgs, iDsd0 );
    Vec_IntPush( p->vArgs, iDsd1 );
    Vec_IntPush( p->vArgs, iDsdC );
    Vec_IntPush( p->vArgs, Type );
    iObj = Hsh_IntManAdd( p->vHash, Vec_IntSize(p->vRes) );
    assert( iObj == Vec_IntSize(p->vRes) );
    Vec_IntPush( p->vRes, Res );
    assert( 4 * Vec_IntSize(p->vRes) == Vec_IntSize(p->vArgs) );
}